

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int arkStep_GetNonlinSolvStats(ARKodeMem ark_mem,long *nniters,long *nnfails)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    *in_RSI = in_stack_ffffffffffffffd8->step_setdeltagammamax;
    *in_RDX = in_stack_ffffffffffffffd8->step_setlsetupfrequency;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkStep_GetNonlinSolvStats(ARKodeMem ark_mem, long int* nniters,
                               long int* nnfails)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  *nniters = step_mem->nls_iters;
  *nnfails = step_mem->nls_fails;

  return (ARK_SUCCESS);
}